

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall Map<String,_String>::Item::updateHeightAndSlope(Item *this)

{
  code *pcVar1;
  int iVar2;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  usize rightHeight;
  usize leftHeight;
  Item *this_local;
  
  if (((this->parent != (Item *)0x0) && (this != this->parent->left)) &&
     (this != this->parent->right)) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                          ,0x16f,"!parent || this == parent->left || this == parent->right");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (this->left == (Item *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = this->left->height;
  }
  if (this->right == (Item *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = this->right->height;
  }
  this->slope = local_30 - local_38;
  if (local_38 < local_30) {
    local_40 = local_30;
  }
  else {
    local_40 = local_38;
  }
  this->height = local_40 + 1;
  return;
}

Assistant:

void updateHeightAndSlope()
    {
      ASSERT(!parent || this == parent->left || this == parent->right);
      usize leftHeight = left ? left->height : 0;
      usize rightHeight = right ? right->height : 0;
      slope = leftHeight - rightHeight;
      height = (leftHeight > rightHeight ? leftHeight : rightHeight) + 1;
    }